

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void iadst16_low1_ssse3(__m128i *input,__m128i *output)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i __rounding;
  __m128i local_118;
  undefined1 local_108 [16];
  __m128i local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 auVar4 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar1 = pshuflw(ZEXT416(0x648),ZEXT416(0x648),0);
  auVar1._4_4_ = auVar1._0_4_;
  auVar1._8_4_ = auVar1._0_4_;
  auVar1._12_4_ = auVar1._0_4_;
  auVar2 = pshuflw(ZEXT416(0xffff8028),ZEXT416(0xffff8028),0);
  auVar2._4_4_ = auVar2._0_4_;
  auVar2._8_4_ = auVar2._0_4_;
  auVar2._12_4_ = auVar2._0_4_;
  local_118 = (__m128i)pmulhrsw(auVar1,(undefined1  [16])*input);
  local_108 = pmulhrsw(auVar2,(undefined1  [16])*input);
  auVar16._0_12_ = local_118._0_12_;
  auVar16._12_2_ = local_118[0]._6_2_;
  auVar16._14_2_ = local_108._6_2_;
  auVar20._12_4_ = auVar16._12_4_;
  auVar20._0_10_ = local_118._0_10_;
  auVar20._10_2_ = local_108._4_2_;
  auVar4._10_6_ = auVar20._10_6_;
  auVar4._0_8_ = local_118[0];
  auVar4._8_2_ = local_118[0]._4_2_;
  auVar3._8_8_ = auVar4._8_8_;
  auVar3._6_2_ = local_108._2_2_;
  auVar3._4_2_ = local_118[0]._2_2_;
  auVar3._0_2_ = (undefined2)local_118[0];
  auVar3._2_2_ = local_108._0_2_;
  auVar8._2_2_ = local_108._8_2_;
  auVar8._0_2_ = (short)local_118[1];
  auVar8._4_2_ = local_118[1]._2_2_;
  auVar8._6_2_ = local_108._10_2_;
  auVar8._8_2_ = local_118[1]._4_2_;
  auVar8._10_2_ = local_108._12_2_;
  auVar8._12_2_ = local_118[1]._6_2_;
  auVar8._14_2_ = local_108._14_2_;
  auVar15._8_4_ = 0x31f0fb1;
  auVar15._0_8_ = 0x31f0fb1031f0fb1;
  auVar15._12_4_ = 0x31f0fb1;
  auVar1 = pmaddwd(auVar3,auVar15);
  auVar16 = pmaddwd(auVar15,auVar8);
  auVar19._8_4_ = 0xf04f031f;
  auVar19._0_8_ = 0xf04f031ff04f031f;
  auVar19._12_4_ = 0xf04f031f;
  auVar2 = pmaddwd(auVar3,auVar19);
  auVar20 = pmaddwd(auVar19,auVar8);
  auVar6._0_4_ = auVar1._0_4_ + 0x800 >> 0xc;
  auVar6._4_4_ = auVar1._4_4_ + 0x800 >> 0xc;
  auVar6._8_4_ = auVar1._8_4_ + 0x800 >> 0xc;
  auVar6._12_4_ = auVar1._12_4_ + 0x800 >> 0xc;
  auVar17._0_4_ = auVar16._0_4_ + 0x800 >> 0xc;
  auVar17._4_4_ = auVar16._4_4_ + 0x800 >> 0xc;
  auVar17._8_4_ = auVar16._8_4_ + 0x800 >> 0xc;
  auVar17._12_4_ = auVar16._12_4_ + 0x800 >> 0xc;
  local_98 = packssdw(auVar6,auVar17);
  auVar7._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar7._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar7._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar7._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar21._0_4_ = auVar20._0_4_ + 0x800 >> 0xc;
  auVar21._4_4_ = auVar20._4_4_ + 0x800 >> 0xc;
  auVar21._8_4_ = auVar20._8_4_ + 0x800 >> 0xc;
  auVar21._12_4_ = auVar20._12_4_ + 0x800 >> 0xc;
  local_88 = packssdw(auVar7,auVar21);
  auVar22._8_4_ = 0x61f0ec8;
  auVar22._0_8_ = 0x61f0ec8061f0ec8;
  auVar22._12_4_ = 0x61f0ec8;
  auVar16 = pmaddwd(auVar3,auVar22);
  auVar20 = pmaddwd(auVar8,auVar22);
  auVar24._8_4_ = 0xf138061f;
  auVar24._0_8_ = 0xf138061ff138061f;
  auVar24._12_4_ = 0xf138061f;
  auVar1 = pmaddwd(auVar3,auVar24);
  auVar2 = pmaddwd(auVar8,auVar24);
  auVar18._0_4_ = auVar16._0_4_ + 0x800 >> 0xc;
  auVar18._4_4_ = auVar16._4_4_ + 0x800 >> 0xc;
  auVar18._8_4_ = auVar16._8_4_ + 0x800 >> 0xc;
  auVar18._12_4_ = auVar16._12_4_ + 0x800 >> 0xc;
  auVar25._0_4_ = auVar20._0_4_ + 0x800 >> 0xc;
  auVar25._4_4_ = auVar20._4_4_ + 0x800 >> 0xc;
  auVar25._8_4_ = auVar20._8_4_ + 0x800 >> 0xc;
  auVar25._12_4_ = auVar20._12_4_ + 0x800 >> 0xc;
  local_d8 = packssdw(auVar18,auVar25);
  auVar5._0_4_ = auVar1._0_4_ + 0x800 >> 0xc;
  auVar5._4_4_ = auVar1._4_4_ + 0x800 >> 0xc;
  auVar5._8_4_ = auVar1._8_4_ + 0x800 >> 0xc;
  auVar5._12_4_ = auVar1._12_4_ + 0x800 >> 0xc;
  auVar9._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar9._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar9._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar9._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  local_c8 = packssdw(auVar5,auVar9);
  auVar13._0_12_ = local_98._0_12_;
  auVar13._12_2_ = local_98._6_2_;
  auVar13._14_2_ = local_88._6_2_;
  auVar12._12_4_ = auVar13._12_4_;
  auVar12._0_10_ = local_98._0_10_;
  auVar12._10_2_ = local_88._4_2_;
  auVar11._10_6_ = auVar12._10_6_;
  auVar11._0_8_ = local_98._0_8_;
  auVar11._8_2_ = local_98._4_2_;
  auVar10._8_8_ = auVar11._8_8_;
  auVar10._6_2_ = local_88._2_2_;
  auVar10._4_2_ = local_98._2_2_;
  auVar10._0_2_ = local_98._0_2_;
  auVar10._2_2_ = local_88._0_2_;
  auVar27._2_2_ = local_88._8_2_;
  auVar27._0_2_ = local_98._8_2_;
  auVar27._4_2_ = local_98._10_2_;
  auVar27._6_2_ = local_88._10_2_;
  auVar27._8_2_ = local_98._12_2_;
  auVar27._10_2_ = local_88._12_2_;
  auVar27._12_2_ = local_98._14_2_;
  auVar27._14_2_ = local_88._14_2_;
  auVar16 = pmaddwd(auVar10,auVar22);
  auVar2 = pmaddwd(auVar22,auVar27);
  auVar1 = pmaddwd(auVar10,auVar24);
  auVar20 = pmaddwd(auVar27,auVar24);
  auVar26._0_4_ = auVar16._0_4_ + 0x800 >> 0xc;
  auVar26._4_4_ = auVar16._4_4_ + 0x800 >> 0xc;
  auVar26._8_4_ = auVar16._8_4_ + 0x800 >> 0xc;
  auVar26._12_4_ = auVar16._12_4_ + 0x800 >> 0xc;
  auVar23._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  local_58 = packssdw(auVar26,auVar23);
  auVar14._0_4_ = auVar1._0_4_ + 0x800 >> 0xc;
  auVar14._4_4_ = auVar1._4_4_ + 0x800 >> 0xc;
  auVar14._8_4_ = auVar1._8_4_ + 0x800 >> 0xc;
  auVar14._12_4_ = auVar1._12_4_ + 0x800 >> 0xc;
  auVar28._0_4_ = auVar20._0_4_ + 0x800 >> 0xc;
  auVar28._4_4_ = auVar20._4_4_ + 0x800 >> 0xc;
  auVar28._8_4_ = auVar20._8_4_ + 0x800 >> 0xc;
  auVar28._12_4_ = auVar20._12_4_ + 0x800 >> 0xc;
  local_48 = packssdw(auVar14,auVar28);
  __rounding[1]._0_4_ = 0x61f0ec8;
  __rounding[0] = 0xf04f031f;
  __rounding[1]._4_4_ = 0;
  local_f8 = local_118;
  local_e8 = local_108;
  local_b8 = local_d8;
  local_a8 = local_c8;
  local_78 = local_98;
  local_68 = local_88;
  local_38 = local_58;
  local_28 = local_48;
  iadst16_stage8_ssse3(&local_118,(int32_t *)0x31f0fb1,__rounding,'(');
  iadst16_stage9_ssse3(output,&local_118);
  return;
}

Assistant:

static void iadst16_low1_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);

  // stage 1
  __m128i x[16];
  x[1] = input[0];

  // stage 2
  btf_16_ssse3(cospi[62], -cospi[2], x[1], x[0], x[1]);

  // stage 3
  x[8] = x[0];
  x[9] = x[1];

  // stage 4
  btf_16_sse2(cospi_p08_p56, cospi_p56_m08, x[8], x[9], x[8], x[9]);

  // stage 5
  x[4] = x[0];
  x[5] = x[1];
  x[12] = x[8];
  x[13] = x[9];

  // stage 6
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x[4], x[5], x[4], x[5]);
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x[12], x[13], x[12], x[13]);

  // stage 7
  x[2] = x[0];
  x[3] = x[1];
  x[6] = x[4];
  x[7] = x[5];
  x[10] = x[8];
  x[11] = x[9];
  x[14] = x[12];
  x[15] = x[13];

  iadst16_stage8_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage9_ssse3(output, x);
}